

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::DefParamSymbol::serializeTo(DefParamSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  
  if (this->initializer == (Expression *)0x0) {
    resolve(this);
  }
  if (this->target != (Symbol *)0x0) {
    name._M_str = "target";
    name._M_len = 6;
    ASTSerializer::writeLink(serializer,name,this->target);
  }
  if (this->initializer == (Expression *)0x0) {
    resolve(this);
  }
  ASTSerializer::write(serializer,5,"value",(size_t)this->initializer->constant);
  return;
}

Assistant:

void DefParamSymbol::serializeTo(ASTSerializer& serializer) const {
    if (auto t = getTarget())
        serializer.writeLink("target", *t);
    serializer.write("value", getValue());
}